

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionFunctionHandler.cpp
# Opt level: O0

bool __thiscall
ExpressionFunctionHandler::addUserFunction
          (ExpressionFunctionHandler *this,Identifier *name,
          vector<Identifier,_std::allocator<Identifier>_> *parameters,
          vector<Token,_std::allocator<Token>_> *content)

{
  bool bVar1;
  Entry local_c0;
  undefined1 local_78 [8];
  anon_class_80_3_66625fa0 executor;
  vector<Token,_std::allocator<Token>_> *content_local;
  vector<Identifier,_std::allocator<Identifier>_> *parameters_local;
  Identifier *name_local;
  ExpressionFunctionHandler *this_local;
  
  executor.content.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)content;
  Identifier::Identifier((Identifier *)local_78,name);
  std::vector<Identifier,_std::allocator<Identifier>_>::vector
            ((vector<Identifier,_std::allocator<Identifier>_> *)
             ((long)&executor.functionName._name.field_2 + 8),parameters);
  std::vector<Token,_std::allocator<Token>_>::vector
            ((vector<Token,_std::allocator<Token>_> *)
             &executor.parameterNames.super__Vector_base<Identifier,_std::allocator<Identifier>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<Token,_std::allocator<Token>_> *)
             executor.content.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  std::
  function<ExpressionValue(std::vector<std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>,std::allocator<std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>>>const&)>
  ::
  function<ExpressionFunctionHandler::addUserFunction(Identifier_const&,std::vector<Identifier,std::allocator<Identifier>>const&,std::vector<Token,std::allocator<Token>>const&)::__0,void>
            ((function<ExpressionValue(std::vector<std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>,std::allocator<std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>>>const&)>
              *)&local_c0,(anon_class_80_3_66625fa0 *)local_78);
  local_c0.minParams = std::vector<Identifier,_std::allocator<Identifier>_>::size(parameters);
  local_c0.maxParams = std::vector<Identifier,_std::allocator<Identifier>_>::size(parameters);
  local_c0.safety = Unsafe;
  bVar1 = registerEntry(this,name,&local_c0);
  Entry::~Entry(&local_c0);
  addUserFunction(Identifier_const&,std::vector<Identifier,std::allocator<Identifier>>const&,std::vector<Token,std::allocator<Token>>const&)
  ::$_0::~__0((__0 *)local_78);
  return bVar1;
}

Assistant:

bool ExpressionFunctionHandler::addUserFunction(const Identifier &name, const std::vector<Identifier> &parameters, const std::vector<Token> &content)
{
	// Executor: Evaluate parameters and instantiate function content with parameter substitutions
	auto executor = [functionName=name, parameterNames=parameters, content](const std::vector<std::unique_ptr<ExpressionInternal>> &parameters) -> ExpressionValue
	{
		// evaluate parameters
		std::vector<ExpressionValue> params;
		params.reserve(parameters.size());

		for (size_t i = 0; i < parameters.size(); i++)
		{
			ExpressionValue result = parameters[i]->evaluate();
			if (!result.isValid())
			{
				Logger::queueError(Logger::Error, "%s: Invalid parameter %d", functionName, i+1);
				return result;
			}

			params.push_back(result);
		}

		// instantiate
		TokenStreamTokenizer tok;
		tok.init(content);

		for (size_t i = 0; i < parameters.size(); ++i)
		{
			const auto &paramName = parameterNames[i];
			const auto &paramValue = params[i];

			switch (paramValue.type)
			{
			case ExpressionValueType::Float:
				tok.registerReplacementFloat(paramName, paramValue.floatValue);
				break;
			case ExpressionValueType::String:
				tok.registerReplacementString(paramName, paramValue.strValue.string());
				break;
			case ExpressionValueType::Integer:
				tok.registerReplacementInteger(paramName, paramValue.intValue);
				break;
			case ExpressionValueType::Invalid: // will not occur, invalid results are caught above
				break;
			}
		}

		Expression result = parseExpression(tok, false);
		if (!result.isLoaded())
		{
			Logger::queueError(Logger::Error, "%s: Failed to parse user function expression", functionName);
			return {};
		}

		if (!tok.atEnd())
		{
			Logger::queueError(Logger::Error, "%s: Unconsumed tokens after parsing user function expresion", functionName);
			return {};
		}

		// evaluate expression
		return result.evaluate();
	};

	return registerEntry(name, Entry{std::move(executor), parameters.size(), parameters.size(), ExpFuncSafety::Unsafe});
}